

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::AnyEq::operator()
          (AnyEq *this,basic_string_view<char,_std::char_traits<char>_> *a,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b)

{
  size_t __n;
  int iVar1;
  
  __n = a->_M_len;
  if (__n != b->_M_string_length) {
    return false;
  }
  if ((__n != 0) && (iVar1 = bcmp(a->_M_str,(b->_M_dataplus)._M_p,__n), iVar1 != 0)) {
    return false;
  }
  return true;
}

Assistant:

bool operator()(const A& a, const B& b) const { return a == b; }